

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_feature_filter.cpp
# Opt level: O0

bool __thiscall
Fossilize::FeatureFilter::Impl::access_mask_is_supported(Impl *this,VkAccessFlags2 access)

{
  size_type sVar1;
  bool bVar2;
  allocator local_a1;
  string local_a0 [37];
  byte local_7b;
  byte local_7a;
  allocator local_79;
  string local_78 [37];
  byte local_53;
  byte local_52;
  allocator local_51;
  string local_50 [32];
  undefined8 local_30;
  VkAccessFlags2 supported_flags;
  VkAccessFlags2 sync2_flags;
  VkAccessFlags2 access_local;
  Impl *this_local;
  
  supported_flags = 0x700000000;
  local_30 = 0x3f7f0fffffff;
  if ((access & 0xffffc080f0000000) == 0) {
    local_52 = 0;
    local_53 = 0;
    bVar2 = false;
    sync2_flags = access;
    access_local = (VkAccessFlags2)this;
    if ((access & 0x1800000000) != 0) {
      std::allocator<char>::allocator();
      local_52 = 1;
      std::__cxx11::string::string(local_50,"VK_KHR_video_decode_queue",&local_51);
      local_53 = 1;
      sVar1 = std::
              unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(&this->enabled_extensions,(key_type *)local_50);
      bVar2 = sVar1 == 0;
    }
    if ((local_53 & 1) != 0) {
      std::__cxx11::string::~string(local_50);
    }
    if ((local_52 & 1) != 0) {
      std::allocator<char>::~allocator((allocator<char> *)&local_51);
    }
    if (bVar2) {
      this_local._7_1_ = false;
    }
    else {
      local_7a = 0;
      local_7b = 0;
      bVar2 = false;
      if ((sync2_flags & 0x6000000000) != 0) {
        std::allocator<char>::allocator();
        local_7a = 1;
        std::__cxx11::string::string(local_78,"VK_KHR_video_encode_queue",&local_79);
        local_7b = 1;
        sVar1 = std::
                unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count(&this->enabled_extensions,(key_type *)local_78);
        bVar2 = sVar1 == 0;
      }
      if ((local_7b & 1) != 0) {
        std::__cxx11::string::~string(local_78);
      }
      if ((local_7a & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)&local_79);
      }
      if (bVar2) {
        this_local._7_1_ = false;
      }
      else if (((sync2_flags & 0xe000000) == 0) ||
              ((this->features).transform_feedback.transformFeedback != 0)) {
        if (((sync2_flags & 0x100000) == 0) ||
           ((this->features).conditional_rendering.conditionalRendering != 0)) {
          bVar2 = false;
          if ((sync2_flags & 0x80000) != 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_a0,"VK_EXT_blend_operation_advanced",&local_a1);
            sVar1 = std::
                    unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::count(&this->enabled_extensions,(key_type *)local_a0);
            bVar2 = sVar1 == 0;
            std::__cxx11::string::~string(local_a0);
            std::allocator<char>::~allocator((allocator<char> *)&local_a1);
          }
          if (bVar2) {
            this_local._7_1_ = false;
          }
          else if (((sync2_flags & 0x600000) == 0) ||
                  ((this->features).acceleration_structure.accelerationStructure != 0)) {
            if (((sync2_flags & 0x1000000) == 0) ||
               ((this->features).fragment_density.fragmentDensityMap != 0)) {
              if (((sync2_flags & 0x800000) == 0) ||
                 ((this->features).fragment_shading_rate.attachmentFragmentShadingRate != 0)) {
                if (((sync2_flags & 0x700000000) == 0) ||
                   ((this->features).synchronization2.synchronization2 != 0)) {
                  if (((sync2_flags & 0x20000000000) == 0) ||
                     ((this->features).descriptor_buffer.descriptorBuffer != 0)) {
                    if (((sync2_flags & 0x10000000000) == 0) ||
                       ((this->features).ray_tracing_maintenance1.rayTracingMaintenance1 != 0)) {
                      if (((sync2_flags & 0x300000000000) == 0) ||
                         ((this->features).opacity_micromap.micromap != 0)) {
                        if (((sync2_flags & 0x60000) == 0) ||
                           (((this->features).device_generated_commands_nv.deviceGeneratedCommands
                             != 0 || ((this->features).device_generated_commands.
                                      deviceGeneratedCommands != 0)))) {
                          if (((sync2_flags & 0xc0000000000) == 0) ||
                             ((this->features).optical_flow_nv.opticalFlow != 0)) {
                            this_local._7_1_ = true;
                          }
                          else {
                            this_local._7_1_ = false;
                          }
                        }
                        else {
                          this_local._7_1_ = false;
                        }
                      }
                      else {
                        this_local._7_1_ = false;
                      }
                    }
                    else {
                      this_local._7_1_ = false;
                    }
                  }
                  else {
                    this_local._7_1_ = false;
                  }
                }
                else {
                  this_local._7_1_ = false;
                }
              }
              else {
                this_local._7_1_ = false;
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool FeatureFilter::Impl::access_mask_is_supported(VkAccessFlags2 access) const
{
	constexpr VkAccessFlags2 sync2_flags =
			VK_ACCESS_2_SHADER_SAMPLED_READ_BIT |
			VK_ACCESS_2_SHADER_STORAGE_WRITE_BIT |
			VK_ACCESS_2_SHADER_STORAGE_READ_BIT;

	constexpr VkAccessFlags2 supported_flags =
			VK_ACCESS_INDIRECT_COMMAND_READ_BIT |
			VK_ACCESS_INDEX_READ_BIT |
			VK_ACCESS_VERTEX_ATTRIBUTE_READ_BIT |
			VK_ACCESS_UNIFORM_READ_BIT |
			VK_ACCESS_INPUT_ATTACHMENT_READ_BIT |
			VK_ACCESS_SHADER_READ_BIT |
			VK_ACCESS_SHADER_WRITE_BIT |
			VK_ACCESS_COLOR_ATTACHMENT_READ_BIT |
			VK_ACCESS_COLOR_ATTACHMENT_WRITE_BIT |
			VK_ACCESS_DEPTH_STENCIL_ATTACHMENT_READ_BIT |
			VK_ACCESS_DEPTH_STENCIL_ATTACHMENT_WRITE_BIT |
			VK_ACCESS_TRANSFER_READ_BIT |
			VK_ACCESS_TRANSFER_WRITE_BIT |
			VK_ACCESS_HOST_READ_BIT |
			VK_ACCESS_HOST_WRITE_BIT |
			VK_ACCESS_MEMORY_READ_BIT |
			VK_ACCESS_MEMORY_WRITE_BIT |
			VK_ACCESS_TRANSFORM_FEEDBACK_WRITE_BIT_EXT |
			VK_ACCESS_TRANSFORM_FEEDBACK_COUNTER_READ_BIT_EXT |
			VK_ACCESS_TRANSFORM_FEEDBACK_COUNTER_WRITE_BIT_EXT |
			VK_ACCESS_CONDITIONAL_RENDERING_READ_BIT_EXT |
			VK_ACCESS_COLOR_ATTACHMENT_READ_NONCOHERENT_BIT_EXT |
			VK_ACCESS_ACCELERATION_STRUCTURE_READ_BIT_KHR |
			VK_ACCESS_ACCELERATION_STRUCTURE_WRITE_BIT_KHR |
			VK_ACCESS_FRAGMENT_DENSITY_MAP_READ_BIT_EXT |
			VK_ACCESS_FRAGMENT_SHADING_RATE_ATTACHMENT_READ_BIT_KHR |
			VK_ACCESS_2_VIDEO_DECODE_WRITE_BIT_KHR |
			VK_ACCESS_2_VIDEO_DECODE_READ_BIT_KHR |
			VK_ACCESS_2_VIDEO_ENCODE_WRITE_BIT_KHR |
			VK_ACCESS_2_VIDEO_ENCODE_READ_BIT_KHR |
			VK_ACCESS_2_DESCRIPTOR_BUFFER_READ_BIT_EXT |
			VK_ACCESS_2_SHADER_BINDING_TABLE_READ_BIT_KHR |
			VK_ACCESS_2_MICROMAP_READ_BIT_EXT |
			VK_ACCESS_2_MICROMAP_WRITE_BIT_EXT |
			VK_ACCESS_2_COMMAND_PREPROCESS_READ_BIT_EXT |
			VK_ACCESS_2_COMMAND_PREPROCESS_WRITE_BIT_EXT |
			VK_ACCESS_2_OPTICAL_FLOW_READ_BIT_NV |
			VK_ACCESS_2_OPTICAL_FLOW_WRITE_BIT_NV |
			sync2_flags;

	if (access & ~supported_flags)
		return false;

	if ((access & (VK_ACCESS_2_VIDEO_DECODE_READ_BIT_KHR | VK_ACCESS_2_VIDEO_DECODE_WRITE_BIT_KHR)) != 0 &&
	    enabled_extensions.count(VK_KHR_VIDEO_DECODE_QUEUE_EXTENSION_NAME) == 0)
		return false;

	if ((access & (VK_ACCESS_2_VIDEO_ENCODE_READ_BIT_KHR | VK_ACCESS_2_VIDEO_ENCODE_WRITE_BIT_KHR)) != 0 &&
	    enabled_extensions.count(VK_KHR_VIDEO_ENCODE_QUEUE_EXTENSION_NAME) == 0)
		return false;

	if ((access & (VK_ACCESS_TRANSFORM_FEEDBACK_WRITE_BIT_EXT |
	               VK_ACCESS_TRANSFORM_FEEDBACK_COUNTER_READ_BIT_EXT |
	               VK_ACCESS_TRANSFORM_FEEDBACK_COUNTER_WRITE_BIT_EXT)) != 0 &&
	    features.transform_feedback.transformFeedback == VK_FALSE)
		return false;

	if ((access & VK_ACCESS_CONDITIONAL_RENDERING_READ_BIT_EXT) != 0 &&
	    features.conditional_rendering.conditionalRendering == VK_FALSE)
		return false;

	if ((access & VK_ACCESS_COLOR_ATTACHMENT_READ_NONCOHERENT_BIT_EXT) != 0 &&
	    enabled_extensions.count(VK_EXT_BLEND_OPERATION_ADVANCED_EXTENSION_NAME) == 0)
		return false;

	if ((access & (VK_ACCESS_ACCELERATION_STRUCTURE_READ_BIT_KHR |
	               VK_ACCESS_ACCELERATION_STRUCTURE_WRITE_BIT_KHR)) != 0 &&
	    features.acceleration_structure.accelerationStructure == VK_FALSE)
		return false;

	if ((access & VK_ACCESS_FRAGMENT_DENSITY_MAP_READ_BIT_EXT) != 0 &&
	    features.fragment_density.fragmentDensityMap == VK_FALSE)
		return false;

	if ((access & VK_ACCESS_FRAGMENT_SHADING_RATE_ATTACHMENT_READ_BIT_KHR) != 0 &&
	    features.fragment_shading_rate.attachmentFragmentShadingRate == VK_FALSE)
		return false;

	if ((access & sync2_flags) != 0 && features.synchronization2.synchronization2 == VK_FALSE)
		return false;

	if ((access & VK_ACCESS_2_DESCRIPTOR_BUFFER_READ_BIT_EXT) != 0 &&
	    features.descriptor_buffer.descriptorBuffer == VK_FALSE)
		return false;

	if ((access & VK_ACCESS_2_SHADER_BINDING_TABLE_READ_BIT_KHR) != 0 &&
	    features.ray_tracing_maintenance1.rayTracingMaintenance1 == VK_FALSE)
		return false;

	if ((access & (VK_ACCESS_2_MICROMAP_WRITE_BIT_EXT | VK_ACCESS_2_MICROMAP_READ_BIT_EXT)) != 0 &&
	    features.opacity_micromap.micromap == VK_FALSE)
		return false;

	if ((access & (VK_ACCESS_2_COMMAND_PREPROCESS_READ_BIT_EXT |
	               VK_ACCESS_2_COMMAND_PREPROCESS_WRITE_BIT_EXT)) != 0 &&
	    features.device_generated_commands_nv.deviceGeneratedCommands == VK_FALSE &&
	    features.device_generated_commands.deviceGeneratedCommands == VK_FALSE)
		return false;

	if ((access & (VK_ACCESS_2_OPTICAL_FLOW_READ_BIT_NV |
	               VK_ACCESS_2_OPTICAL_FLOW_WRITE_BIT_NV)) != 0 &&
	    features.optical_flow_nv.opticalFlow == VK_FALSE)
		return false;

	return true;
}